

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

void __thiscall
lossless_neural_sound::expression_compiler::expression::Product::write_code
          (Product *this,ostream *os,Code_writing_state *state)

{
  unordered_map<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>_>_>
  *this_00;
  Expression_node *pEVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  long *plVar4;
  string *psVar5;
  string local_50;
  
  this_00 = &state->states;
  local_50._M_dataplus._M_p = (pointer)this;
  pmVar2 = std::__detail::
           _Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_50);
  if (pmVar2->written == false) {
    pmVar2->written = true;
    pEVar1 = (this->
             super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>).
             left_node;
    (*(pEVar1->super_Node)._vptr_Node[8])(pEVar1,os,state);
    pEVar1 = (this->
             super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>).
             right_node;
    (*(pEVar1->super_Node)._vptr_Node[8])(pEVar1,os,state);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(state->options).indent._M_dataplus._M_p,
                        (state->options).indent._M_string_length);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(state->options).value_type._M_dataplus._M_p,
                        (state->options).value_type._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    if ((pmVar2->cached_variable_name)._M_string_length == 0) {
      plVar4 = (long *)__dynamic_cast(this,&Expression_node::typeinfo,&Variable::typeinfo,0);
      if (plVar4 == (long *)0x0) {
        Expression_node::Code_writing_state::make_temporary_abi_cxx11_(&local_50,state);
      }
      else {
        (**(code **)(*plVar4 + 0x68))(&local_50,plVar4);
      }
      std::__cxx11::string::operator=((string *)&pmVar2->cached_variable_name,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(pmVar2->cached_variable_name)._M_dataplus._M_p,
                        (pmVar2->cached_variable_name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    pEVar1 = (this->
             super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>).
             left_node;
    local_50._M_dataplus._M_p = (pointer)pEVar1;
    pmVar2 = std::__detail::
             _Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_50);
    psVar5 = Expression_node::Code_writing_state::State::get_variable_name_abi_cxx11_
                       (pmVar2,pEVar1,state);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," * ",3);
    pEVar1 = (this->
             super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>).
             right_node;
    local_50._M_dataplus._M_p = (pointer)pEVar1;
    pmVar2 = std::__detail::
             _Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_50);
    psVar5 = Expression_node::Code_writing_state::State::get_variable_name_abi_cxx11_
                       (pmVar2,pEVar1,state);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n",2);
  }
  return;
}

Assistant:

virtual void write_code(std::ostream &os, Code_writing_state &state) const override
    {
        auto &node_state = state.get_state(this);
        if(node_state.written)
            return;
        node_state.written = true;
        left_node->write_code(os, state);
        right_node->write_code(os, state);
        os << state.options.indent << state.options.value_type << " "
           << node_state.get_variable_name(this, state) << " = "
           << state.get_variable_name(left_node) << " * " << state.get_variable_name(right_node)
           << ";\n";
    }